

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmMakefile.cxx
# Opt level: O1

void __thiscall
cmMakefile::IncludeScope::IncludeScope
          (IncludeScope *this,cmMakefile *mf,string *filenametoread,bool noPolicyScope)

{
  cmMakefile *pcVar1;
  cmCommandContext *entryPointCommand;
  PolicyStatus PVar2;
  Snapshot local_38;
  undefined8 uStack_20;
  
  this->Makefile = mf;
  this->NoPolicyScope = noPolicyScope;
  this->CheckCMP0011 = false;
  this->ReportError = true;
  PushFunctionBlockerBarrier(mf);
  pcVar1 = this->Makefile;
  entryPointCommand =
       (pcVar1->ContextStack).
       super__Vector_base<const_cmCommandContext_*,_std::allocator<const_cmCommandContext_*>_>.
       _M_impl.super__Vector_impl_data._M_finish[-1];
  cmState::CreateCallStackSnapshot
            (&local_38,pcVar1->GlobalGenerator->CMakeInstance->State,pcVar1->StateSnapshot,
             &entryPointCommand->Name,entryPointCommand->Line,filenametoread);
  pcVar1 = this->Makefile;
  (pcVar1->StateSnapshot).Position.Position = local_38.Position.Position;
  (pcVar1->StateSnapshot).State = local_38.State;
  (pcVar1->StateSnapshot).Position.Tree = local_38.Position.Tree;
  if (this->NoPolicyScope == false) {
    PVar2 = cmState::Snapshot::GetPolicy(&this->Makefile->StateSnapshot,CMP0011);
    switch(PVar2) {
    case OLD:
      this->NoPolicyScope = true;
      break;
    case WARN:
      local_38.Position.Position = 0;
      uStack_20 = 0;
      local_38.State = (cmState *)0x0;
      local_38.Position.Tree = (cmLinkedTree<cmState::SnapshotDataType> *)0x0;
      cmState::Snapshot::PushPolicy
                (&this->Makefile->StateSnapshot,(PolicyMap)ZEXT1632(ZEXT816(0)),true);
      this->CheckCMP0011 = true;
      break;
    case REQUIRED_IF_USED:
    case REQUIRED_ALWAYS:
      this->CheckCMP0011 = true;
    case NEW:
      local_38.Position.Position = 0;
      uStack_20 = 0;
      local_38.State = (cmState *)0x0;
      local_38.Position.Tree = (cmLinkedTree<cmState::SnapshotDataType> *)0x0;
      cmState::Snapshot::PushPolicy
                (&this->Makefile->StateSnapshot,(PolicyMap)ZEXT1632(ZEXT816(0)),false);
    }
  }
  return;
}

Assistant:

cmMakefile::IncludeScope::IncludeScope(cmMakefile* mf,
                                       std::string const& filenametoread,
                                       bool noPolicyScope):
  Makefile(mf), NoPolicyScope(noPolicyScope),
  CheckCMP0011(false), ReportError(true)
{
  this->Makefile->PushFunctionBlockerBarrier();

  this->Makefile->StateSnapshot =
      this->Makefile->GetState()->CreateCallStackSnapshot(
        this->Makefile->StateSnapshot,
        this->Makefile->ContextStack.back()->Name,
        this->Makefile->ContextStack.back()->Line,
        filenametoread);
  if(!this->NoPolicyScope)
    {
    // Check CMP0011 to determine the policy scope type.
    switch (this->Makefile->GetPolicyStatus(cmPolicies::CMP0011))
      {
      case cmPolicies::WARN:
        // We need to push a scope to detect whether the script sets
        // any policies that would affect the includer and therefore
        // requires a warning.  We use a weak scope to simulate OLD
        // behavior by allowing policy changes to affect the includer.
        this->Makefile->PushPolicy(true);
        this->CheckCMP0011 = true;
        break;
      case cmPolicies::OLD:
        // OLD behavior is to not push a scope at all.
        this->NoPolicyScope = true;
        break;
      case cmPolicies::REQUIRED_IF_USED:
      case cmPolicies::REQUIRED_ALWAYS:
        // We should never make this policy required, but we handle it
        // here just in case.
        this->CheckCMP0011 = true;
      case cmPolicies::NEW:
        // NEW behavior is to push a (strong) scope.
        this->Makefile->PushPolicy();
        break;
      }
    }
}